

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterNext_None(Fts5Index *p,Fts5SegIter *pIter,int *pbNewTerm)

{
  Fts5Hash *pHash;
  Fts5HashEntry *p_00;
  u8 *puVar1;
  Fts5Data *pFVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uchar *p_01;
  Fts5HashEntry *p_1;
  u32 nData;
  long in_FS_OFFSET;
  bool bVar6;
  int nKeep;
  u64 iDelta;
  Fts5HashEntry *local_50;
  u32 local_44;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (int)pIter->iLeafOffset;
  bVar6 = pIter->pSeg == (Fts5StructureSegment *)0x0;
  if ((!bVar6) && (pIter->pLeaf->szLeaf <= iVar4)) {
    iVar4 = 4;
    do {
      fts5SegIterNextPage(p,pIter);
      if ((p->rc != 0) || (pIter->pLeaf == (Fts5Data *)0x0)) goto LAB_001ead18;
      pIter->iRowid = 0;
      bVar6 = pIter->pSeg == (Fts5StructureSegment *)0x0;
    } while ((!bVar6) && (pIter->pLeaf->szLeaf < 5));
  }
  if (iVar4 < pIter->iEndofDoclist) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    bVar3 = sqlite3Fts5GetVarint(pIter->pLeaf->p + iVar4,(u64 *)&local_40);
    pIter->iLeafOffset = (long)(int)((uint)bVar3 + iVar4);
    pIter->iRowid = (i64)(local_40 + pIter->iRowid);
  }
  else {
    if ((pIter->flags & 1) != 0) {
LAB_001ead07:
      sqlite3_free(pIter->pLeaf);
      pIter->pLeaf = (Fts5Data *)0x0;
LAB_001ead18:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_001ead37;
    }
    if (bVar6) {
      pHash = p->pHash;
      p_00 = pHash->pScan->pScanNext;
      pHash->pScan = p_00;
      if (p_00 == (Fts5HashEntry *)0x0) {
        p_01 = (uchar *)0x0;
        local_50 = (Fts5HashEntry *)0x0;
        nData = 0;
        iVar4 = 0;
      }
      else {
        local_50 = p_00 + 1;
        nData = p_00->nKey;
        fts5HashAddPoslistSize(pHash,p_00,(Fts5HashEntry *)0x0);
        p_01 = (uchar *)((long)&p_00[1].pHashNext + (long)(int)nData);
        iVar4 = (p_00->nData - nData) + -0x30;
      }
      if (p_01 == (uchar *)0x0) goto LAB_001ead07;
      pFVar2 = pIter->pLeaf;
      pFVar2->p = p_01;
      pFVar2->nn = iVar4;
      pFVar2->szLeaf = iVar4;
      pIter->iEndofDoclist = iVar4;
      (pIter->term).n = 0;
      sqlite3Fts5BufferAppendBlob(&p->rc,&pIter->term,nData,(u8 *)local_50);
      bVar3 = sqlite3Fts5GetVarint(p_01,(u64 *)&pIter->iRowid);
      pIter->iLeafOffset = (ulong)bVar3;
    }
    else {
      local_44 = 0;
      local_40 = (undefined1 *)CONCAT44(local_40._4_4_,0xaaaaaaaa);
      puVar1 = pIter->pLeaf->p;
      sqlite3Fts5GetVarint32(puVar1 + pIter->pLeaf->szLeaf,(u32 *)&local_40);
      if (iVar4 != (int)local_40) {
        iVar5 = sqlite3Fts5GetVarint32(puVar1 + iVar4,&local_44);
        iVar4 = iVar4 + iVar5;
      }
      pIter->iLeafOffset = (long)iVar4;
      fts5SegIterLoadTerm(p,pIter,local_44);
    }
    if (pbNewTerm != (int *)0x0) {
      *pbNewTerm = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    fts5SegIterLoadNPos(p,pIter);
    return;
  }
LAB_001ead37:
  __stack_chk_fail();
}

Assistant:

static void fts5SegIterNext_None(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbNewTerm                  /* OUT: Set for new term */
){
  int iOff;

  assert( p->rc==SQLITE_OK );
  assert( (pIter->flags & FTS5_SEGITER_REVERSE)==0 );
  assert( p->pConfig->eDetail==FTS5_DETAIL_NONE );

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  iOff = pIter->iLeafOffset;

  /* Next entry is on the next page */
  while( pIter->pSeg && iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( p->rc || pIter->pLeaf==0 ) return;
    pIter->iRowid = 0;
    iOff = 4;
  }

  if( iOff<pIter->iEndofDoclist ){
    /* Next entry is on the current page */
    u64 iDelta;
    iOff += sqlite3Fts5GetVarint(&pIter->pLeaf->p[iOff], (u64*)&iDelta);
    pIter->iLeafOffset = iOff;
    pIter->iRowid += iDelta;
  }else if( (pIter->flags & FTS5_SEGITER_ONETERM)==0 ){
    if( pIter->pSeg ){
      int nKeep = 0;
      if( iOff!=fts5LeafFirstTermOff(pIter->pLeaf) ){
        iOff += fts5GetVarint32(&pIter->pLeaf->p[iOff], nKeep);
      }
      pIter->iLeafOffset = iOff;
      fts5SegIterLoadTerm(p, pIter, nKeep);
    }else{
      const u8 *pList = 0;
      const char *zTerm = 0;
      int nTerm = 0;
      int nList;
      sqlite3Fts5HashScanNext(p->pHash);
      sqlite3Fts5HashScanEntry(p->pHash, &zTerm, &nTerm, &pList, &nList);
      if( pList==0 ) goto next_none_eof;
      pIter->pLeaf->p = (u8*)pList;
      pIter->pLeaf->nn = nList;
      pIter->pLeaf->szLeaf = nList;
      pIter->iEndofDoclist = nList;
      sqlite3Fts5BufferSet(&p->rc,&pIter->term, nTerm, (u8*)zTerm);
      pIter->iLeafOffset = fts5GetVarint(pList, (u64*)&pIter->iRowid);
    }

    if( pbNewTerm ) *pbNewTerm = 1;
  }else{
    goto next_none_eof;
  }

  fts5SegIterLoadNPos(p, pIter);

  return;
 next_none_eof:
  fts5DataRelease(pIter->pLeaf);
  pIter->pLeaf = 0;
}